

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

_compatible_internalformat_pairs *
gl4cts::TextureViewUtilities::getLegalTextureAndViewInternalformatCombinations(void)

{
  bool bVar1;
  reference __a;
  reference __b;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_RDI;
  pair<unsigned_int,_unsigned_int> local_80;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  _internalformats_const_iterator right_iterator;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  _internalformats_const_iterator left_iterator;
  undefined1 local_38 [8];
  _internalformats view_class_internalformats;
  _view_class local_18;
  _view_class current_view_class;
  int current_view_class_it;
  _compatible_internalformat_pairs *result;
  
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(in_RDI);
  for (local_18 = VIEW_CLASS_128_BITS; local_18 != VIEW_CLASS_COUNT;
      local_18 = local_18 + VIEW_CLASS_96_BITS) {
    view_class_internalformats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_18;
    getInternalformatsFromViewClass((_internalformats *)local_38,local_18);
    local_58._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_50,&local_58);
    while( true ) {
      right_iterator._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
      bVar1 = __gnu_cxx::operator!=
                        (&local_50,
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&right_iterator);
      if (!bVar1) break;
      local_70._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_68,&local_70);
      while( true ) {
        local_78._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
        bVar1 = __gnu_cxx::operator!=(&local_68,&local_78);
        if (!bVar1) break;
        __a = __gnu_cxx::
              __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&local_50);
        __b = __gnu_cxx::
              __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&local_68);
        std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
                  (&local_80,__a,__b);
        std::
        vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ::push_back(in_RDI,&local_80);
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_68);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_50,0);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  }
  return in_RDI;
}

Assistant:

TextureViewUtilities::_compatible_internalformat_pairs TextureViewUtilities::
	getLegalTextureAndViewInternalformatCombinations()
{
	_compatible_internalformat_pairs result;

	/* Iterate over all view classes */
	for (int current_view_class_it = static_cast<int>(VIEW_CLASS_FIRST);
		 current_view_class_it != static_cast<int>(VIEW_CLASS_COUNT); current_view_class_it++)
	{
		_view_class		 current_view_class			= static_cast<_view_class>(current_view_class_it);
		_internalformats view_class_internalformats = getInternalformatsFromViewClass(current_view_class);

		/* Store all combinations in the result vector */
		for (_internalformats_const_iterator left_iterator = view_class_internalformats.begin();
			 left_iterator != view_class_internalformats.end(); left_iterator++)
		{
			for (_internalformats_const_iterator right_iterator = view_class_internalformats.begin();
				 right_iterator != view_class_internalformats.end(); ++right_iterator)
			{
				result.push_back(_internalformat_pair(*left_iterator, *right_iterator));
			} /* for (all internalformats to be used as right-side values) */
		}	 /* for (all internalformats to be used as left-side values) */
	}		  /* for (all view classes) */

	return result;
}